

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O2

uchar * ableton::link::v1::detail::
        encodeMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                  (MessageType messageType,
                  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
                  *payload,uchar *out)

{
  uchar *puVar1;
  
  puVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,unsigned_char*>("_link_v\x01","",out);
  *puVar1 = messageType;
  puVar1 = discovery::toNetworkByteStream<unsigned_char*>(payload,puVar1 + 1);
  return puVar1;
}

Assistant:

It encodeMessage(const MessageType messageType, const Payload& payload, It out)
{
  using namespace std;
  const MessageHeader header = {messageType};
  const auto messageSize =
    kProtocolHeader.size() + sizeInByteStream(header) + sizeInByteStream(payload);

  if (messageSize < kMaxMessageSize)
  {
    return toNetworkByteStream(
      payload, toNetworkByteStream(
                 header, copy(begin(kProtocolHeader), end(kProtocolHeader), move(out))));
  }
  else
  {
    throw range_error("Exceeded maximum message size");
  }
}